

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::LevelParameterErrorsTest::iterate
          (LevelParameterErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  uint local_e4;
  GLuint i;
  bool is_valid;
  GLuint all_pnames_count;
  GLenum all_pnames [23];
  undefined8 uStack_68;
  GLint storei [4];
  GLfloat storef [4];
  GLenum local_40;
  undefined4 local_3c;
  GLenum pname_invalid;
  GLint max_level;
  GLuint texture_invalid;
  GLuint texture_2D;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  LevelParameterErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  texture_2D = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture_2D);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  texture_invalid._3_1_ =
       glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)texture_invalid._3_1_)) {
    texture_invalid._2_1_ = 1;
    texture_invalid._1_1_ = 0;
    max_level = 0;
    pname_invalid = 0;
    local_3c = 0;
    local_40 = 0;
    storei[2] = 0;
    storei[3] = 0;
    uStack_68 = 0;
    storei[0] = 0;
    storei[1] = 0;
    (**(code **)(lStack_20 + 0x6f8))(1,&max_level);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3251);
    (**(code **)(lStack_20 + 0xb8))(0xde1,max_level);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3254);
    (**(code **)(lStack_20 + 0x1380))(0xde1,1,0x8229,1);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3257);
    (**(code **)(lStack_20 + 0x868))(0xd33,&local_3c);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x325b);
    do {
      pname_invalid = pname_invalid + 1;
      cVar1 = (**(code **)(lStack_20 + 0xcc8))();
    } while (cVar1 != '\0');
    memcpy(&stack0xffffffffffffff28,&DAT_02a7a620,0x5c);
    bVar2 = true;
LAB_01237183:
    if (bVar2) {
      bVar2 = false;
      local_40 = local_40 + 1;
      for (local_e4 = 0; local_e4 < 0x17; local_e4 = local_e4 + 1) {
        if (all_pnames[(ulong)local_e4 - 2] == local_40) {
          bVar2 = true;
          break;
        }
      }
      goto LAB_01237183;
    }
    (**(code **)(lStack_20 + 0xae0))(pname_invalid,0,0x1000,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureLevelParameterfv",
                       "texture is not the name of an existing texture object.");
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae8))(pname_invalid,0,0x1000,&uStack_68);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureLevelParameteriv",
                       "texture is not the name of an existing texture object.");
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae0))(max_level,0xffffffff,0x1000,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glGetTextureLevelParameterfv","level is less than 0.");
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae8))(max_level,0xffffffff,0x1000,&uStack_68);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glGetTextureLevelParameteriv","level is less than 0.");
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae0))(max_level,0,local_40,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureLevelParameterfv","pname is not one of supported constants.");
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae8))(max_level,0,local_40,&uStack_68);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureLevelParameteriv","pname is not one of supported constants.");
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae0))(max_level,local_3c,0x1000,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glGetTextureLevelParameterfv",
                       "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE."
                      );
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae8))(max_level,local_3c,0x1000,&uStack_68);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glGetTextureLevelParameteriv",
                       "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE."
                      );
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae0))(max_level,0,0x86a0,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureLevelParameterfv",
                       "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed internal format or on proxy targets."
                      );
    texture_invalid._2_1_ = bVar2 & texture_invalid._2_1_;
    (**(code **)(lStack_20 + 0xae8))(max_level,0,0x86a0,&uStack_68);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureLevelParameteriv",
                       "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed internal format or on proxy targets."
                      );
    texture_invalid._2_1_ = (texture_invalid._2_1_ & 1 & bVar2) != 0;
    if (max_level != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    do {
      iVar3 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar3 != 0);
    if ((texture_invalid._2_1_ & 1) == 0) {
      if ((texture_invalid._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult LevelParameterErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture_2D		= 0;
	glw::GLuint texture_invalid = 0;
	glw::GLint  max_level		= 0;
	glw::GLenum pname_invalid   = 0;

	glw::GLfloat storef[4] = {};
	glw::GLint   storei[4] = {};

	try
	{
		/* Preparations. */

		/* 2D texture */
		gl.genTextures(1, &texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_2D, texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R8, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		/* Limits. */
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &max_level); /* assuming that x > log(x) */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		/* invalid texture */
		while (gl.isTexture(++texture_invalid))
			;

		/* invalid pname */
		glw::GLenum all_pnames[] = { GL_TEXTURE_WIDTH,
									 GL_TEXTURE_HEIGHT,
									 GL_TEXTURE_DEPTH,
									 GL_TEXTURE_SAMPLES,
									 GL_TEXTURE_FIXED_SAMPLE_LOCATIONS,
									 GL_TEXTURE_INTERNAL_FORMAT,
									 GL_TEXTURE_RED_SIZE,
									 GL_TEXTURE_GREEN_SIZE,
									 GL_TEXTURE_BLUE_SIZE,
									 GL_TEXTURE_ALPHA_SIZE,
									 GL_TEXTURE_DEPTH_SIZE,
									 GL_TEXTURE_STENCIL_SIZE,
									 GL_TEXTURE_SHARED_SIZE,
									 GL_TEXTURE_RED_TYPE,
									 GL_TEXTURE_GREEN_TYPE,
									 GL_TEXTURE_BLUE_TYPE,
									 GL_TEXTURE_ALPHA_TYPE,
									 GL_TEXTURE_DEPTH_TYPE,
									 GL_TEXTURE_COMPRESSED,
									 GL_TEXTURE_COMPRESSED_IMAGE_SIZE,
									 GL_TEXTURE_BUFFER_DATA_STORE_BINDING,
									 GL_TEXTURE_BUFFER_OFFSET,
									 GL_TEXTURE_BUFFER_SIZE };

		glw::GLuint all_pnames_count = sizeof(all_pnames) / sizeof(all_pnames[0]);

		bool is_valid = true;

		while (is_valid)
		{
			is_valid = false;

			++pname_invalid;

			for (glw::GLuint i = 0; i < all_pnames_count; ++i)
			{
				if (all_pnames[i] == pname_invalid)
				{
					is_valid = true;

					break;
				}
			}
		}

		/* Tests. */

		/* Check that INVALID_OPERATION is generated by GetTextureLevelParameterfv
		 and GetTextureLevelParameteriv functions if texture is not the name of
		 an existing texture object. */
		gl.getTextureLevelParameterfv(texture_invalid, 0, GL_TEXTURE_WIDTH, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameterfv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureLevelParameteriv(texture_invalid, 0, GL_TEXTURE_WIDTH, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameteriv",
								  "texture is not the name of an existing texture object.");

		/* Check that INVALID_VALUE is generated by GetTextureLevelParameter* if
		 level is less than 0. */
		gl.getTextureLevelParameterfv(texture_2D, -1, GL_TEXTURE_WIDTH, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameterfv", "level is less than 0.");

		gl.getTextureLevelParameteriv(texture_2D, -1, GL_TEXTURE_WIDTH, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameteriv", "level is less than 0.");

		/* Check that INVALID_ENUM error is generated by GetTextureLevelParameter*
		 if pname is not one of supported constants. */
		gl.getTextureLevelParameterfv(texture_2D, 0, pname_invalid, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureLevelParameterfv",
								  "pname is not one of supported constants.");

		gl.getTextureLevelParameteriv(texture_2D, 0, pname_invalid, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureLevelParameteriv",
								  "pname is not one of supported constants.");

		/* Check that INVALID_VALUE may be generated if level is greater than
		 log2 max, where max is the returned value of MAX_TEXTURE_SIZE. */
		gl.getTextureLevelParameterfv(texture_2D, max_level, GL_TEXTURE_WIDTH, storef);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameterfv",
							 "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE.");

		gl.getTextureLevelParameteriv(texture_2D, max_level, GL_TEXTURE_WIDTH, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameteriv",
							 "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE.");

		/* Check that INVALID_OPERATION is generated by GetTextureLevelParameter*
		 if TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an
		 uncompressed internal format or on proxy targets. */
		gl.getTextureLevelParameterfv(texture_2D, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameterfv",
								  "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed "
								  "internal format or on proxy targets.");

		gl.getTextureLevelParameteriv(texture_2D, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameteriv",
								  "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed "
								  "internal format or on proxy targets.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_2D)
	{
		gl.deleteTextures(1, &texture_2D);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}